

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

bool __thiscall
ON_SubDMesh::GetFaceCenterPointAndNormal(ON_SubDMesh *this,ON_SubDFace *face,double *P,double *N)

{
  byte bVar1;
  element_type *peVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ON_SubDMeshFragment *this_00;
  
  dVar5 = ON_DBL_QNAN;
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = dVar5;
    P[2] = dVar5;
  }
  dVar5 = ON_DBL_QNAN;
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = dVar5;
    N[2] = dVar5;
  }
  if ((face != (ON_SubDFace *)0x0) &&
     (peVar2 = (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar2 != (element_type *)0x0)) {
    for (this_00 = peVar2->m_first_fragment; this_00 != (ON_SubDMeshFragment *)0x0;
        this_00 = this_00->m_next_fragment) {
      if (this_00->m_face == face) {
        pdVar3 = this_00->m_P;
        if (pdVar3 == (double *)0x0) {
          return false;
        }
        pdVar4 = this_00->m_N;
        if (pdVar4 == (double *)0x0) {
          return false;
        }
        bVar1 = (this_00->m_grid).m_side_segment_count;
        bVar6 = ON_SubDMeshFragment::IsFullFaceFragment(this_00);
        uVar8 = (bVar1 + 2) * (uint)bVar1 >> 1;
        if (!bVar6) {
          uVar8 = 0;
        }
        if (this_00->m_P_stride < 3) {
          return false;
        }
        if ((this_00->m_vertex_count_etc & 0x1fff) <= uVar8) {
          return false;
        }
        lVar9 = this_00->m_N_stride * (ulong)uVar8;
        if (P != (double *)0x0) {
          lVar7 = this_00->m_P_stride * (ulong)uVar8;
          *P = pdVar3[lVar7];
          P[1] = pdVar3[lVar7 + 1];
          P[2] = pdVar3[lVar7 + 2];
        }
        if (N != (double *)0x0) {
          *N = pdVar4[lVar9];
          N[1] = pdVar4[lVar9 + 1];
          N[2] = pdVar4[lVar9 + 2];
          return true;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDMesh::GetFaceCenterPointAndNormal(
  const class ON_SubDFace* face,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  const ON_SubDMeshFragment* fragment = FaceFragment(face);
  if (nullptr == fragment)
    return false;
  if (nullptr == fragment->m_P || nullptr == fragment->m_N)
    return false;
  const unsigned int n = fragment->m_grid.m_side_segment_count;
  const unsigned int P_dex = fragment->IsFullFaceFragment() ? (n*(n + 2) / 2) : 0;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}